

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniform01_dist.hpp
# Opt level: O2

result_type_conflict2 __thiscall
trng::uniform01_dist<double>::icdf(uniform01_dist<double> *this,result_type_conflict2 x)

{
  int *piVar1;
  
  if ((0.0 <= x) && (x <= 1.0)) {
    return x;
  }
  piVar1 = __errno_location();
  *piVar1 = 0x21;
  return NAN;
}

Assistant:

icdf(result_type x) const {
      if (x < 0 or x > 1) {
#if !(defined TRNG_CUDA)
        errno = EDOM;
#endif
        return math::numeric_limits<result_type>::quiet_NaN();
      }
      return x;
    }